

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
lshbox::parseParams_abi_cxx11_
          (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,lshbox *this,int argc,char **argv)

{
  char *__s;
  size_t sVar1;
  ostream *this_00;
  mapped_type *this_01;
  undefined4 in_register_00000014;
  allocator local_b9;
  string local_b8 [8];
  string value;
  allocator local_91;
  string local_90 [32];
  string local_70 [8];
  string key;
  int local_3c;
  int local_38;
  int idx;
  int sepIdx;
  int length;
  char *pair;
  int i;
  char **argv_local;
  int argc_local;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *params;
  
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unordered_map(__return_storage_ptr__);
  pair._0_4_ = 1;
  while( true ) {
    if ((int)this <= (int)pair) {
      return __return_storage_ptr__;
    }
    __s = *(char **)(CONCAT44(in_register_00000014,argc) + (long)(int)pair * 8);
    strlen(__s);
    local_38 = -1;
    for (local_3c = 0; sVar1 = strlen(__s), (ulong)(long)local_3c < sVar1; local_3c = local_3c + 1)
    {
      if (__s[local_3c] == '=') {
        local_38 = local_3c;
      }
    }
    sVar1 = strlen(__s);
    if ((((sVar1 < 3) || (*__s != '-')) || (__s[1] != '-')) || (local_38 == -1)) break;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,__s,&local_91);
    std::__cxx11::string::string(local_70,local_90,2,(long)(local_38 + -2));
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b8,__s + (long)local_38 + 1,&local_b9);
    std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    this_01 = std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](__return_storage_ptr__,(key_type *)local_70);
    std::__cxx11::string::operator=((string *)this_01,local_b8);
    std::__cxx11::string::~string(local_b8);
    std::__cxx11::string::~string(local_70);
    pair._0_4_ = (int)pair + 1;
  }
  this_00 = std::operator<<((ostream *)&std::cout,
                            "arguments error, format should be --[key]=[value]");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  __assert_fail("false",
                "/workspace/llm4binary/github/license_all_cmakelists_25/xinyandai[P]exactNNS/include/common/util.h"
                ,0x22,"unordered_map<string, string> lshbox::parseParams(int, const char **)");
}

Assistant:

unordered_map<string, string> parseParams(int argc, const char** argv) {
        unordered_map<string, string> params;
        for (int i = 1; i < argc; ++i) {
            const char* pair = argv[i];
            int length = strlen(pair);
            int sepIdx = -1;
            for (int idx = 0; idx < strlen(pair); ++idx) {
                if (pair[idx] == '=')
                    sepIdx = idx;
            }
            if (strlen(pair) < 3 || pair[0] != '-' || pair[1] != '-' || sepIdx == -1) {
                std::cout << "arguments error, format should be --[key]=[value]" << std::endl;
                assert(false);
            }
            string key(pair, 2, sepIdx - 2);
            string value(pair + sepIdx + 1);
            params[key] = value;
        }
        return params;
    }